

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrCoveringRange(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr loc)

{
  xmlElementType xVar1;
  xmlDocPtr cur;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  int indx;
  xmlNodePtr node;
  xmlXPathObjectPtr loc_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (loc == (xmlXPathObjectPtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0))
          || (ctxt->context->doc == (xmlDocPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (loc->type == XPATH_POINT) {
    ctxt_local = (xmlXPathParserContextPtr)
                 xmlXPtrNewRange((xmlNodePtr)loc->user,loc->index,(xmlNodePtr)loc->user,loc->index);
  }
  else if (loc->type == XPATH_RANGE) {
    if (loc->user2 == (void *)0x0) {
      cur = (xmlDocPtr)loc->user;
      if (cur == ctxt->context->doc) {
        iVar3 = xmlXPtrGetArity((xmlNodePtr)cur);
        ctxt_local = (xmlXPathParserContextPtr)
                     xmlXPtrNewRange((xmlNodePtr)cur,0,(xmlNodePtr)cur,iVar3);
      }
      else {
        xVar1 = cur->type;
        if (xVar1 != XML_ELEMENT_NODE) {
          if (xVar1 == XML_ATTRIBUTE_NODE) {
            iVar3 = xmlXPtrGetArity((xmlNodePtr)cur);
            pxVar4 = xmlXPtrNewRange((xmlNodePtr)cur,0,(xmlNodePtr)cur,iVar3);
            return pxVar4;
          }
          if (((2 < xVar1 - XML_TEXT_NODE) && (2 < xVar1 - XML_PI_NODE)) &&
             (1 < xVar1 - XML_NOTATION_NODE)) {
            return (xmlXPathObjectPtr)0x0;
          }
        }
        iVar3 = xmlXPtrGetIndex((xmlNodePtr)cur);
        ctxt_local = (xmlXPathParserContextPtr)
                     xmlXPtrNewRange(cur->parent,iVar3 + -1,cur->parent,iVar3 + 1);
      }
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)
                   xmlXPtrNewRange((xmlNodePtr)loc->user,loc->index,(xmlNodePtr)loc->user2,
                                   loc->index2);
    }
  }
  else {
    pp_Var5 = __xmlGenericError();
    p_Var2 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar6,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpointer.c"
              ,0x7d5);
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPtrCoveringRange(xmlXPathParserContextPtr ctxt, xmlXPathObjectPtr loc) {
    if (loc == NULL)
	return(NULL);
    if ((ctxt == NULL) || (ctxt->context == NULL) ||
	(ctxt->context->doc == NULL))
	return(NULL);
    switch (loc->type) {
        case XPATH_POINT:
	    return(xmlXPtrNewRange(loc->user, loc->index,
			           loc->user, loc->index));
        case XPATH_RANGE:
	    if (loc->user2 != NULL) {
		return(xmlXPtrNewRange(loc->user, loc->index,
			              loc->user2, loc->index2));
	    } else {
		xmlNodePtr node = (xmlNodePtr) loc->user;
		if (node == (xmlNodePtr) ctxt->context->doc) {
		    return(xmlXPtrNewRange(node, 0, node,
					   xmlXPtrGetArity(node)));
		} else {
		    switch (node->type) {
			case XML_ATTRIBUTE_NODE:
			/* !!! our model is slightly different than XPath */
			    return(xmlXPtrNewRange(node, 0, node,
					           xmlXPtrGetArity(node)));
			case XML_ELEMENT_NODE:
			case XML_TEXT_NODE:
			case XML_CDATA_SECTION_NODE:
			case XML_ENTITY_REF_NODE:
			case XML_PI_NODE:
			case XML_COMMENT_NODE:
			case XML_DOCUMENT_NODE:
			case XML_NOTATION_NODE:
			case XML_HTML_DOCUMENT_NODE: {
			    int indx = xmlXPtrGetIndex(node);

			    node = node->parent;
			    return(xmlXPtrNewRange(node, indx - 1,
					           node, indx + 1));
			}
			default:
			    return(NULL);
		    }
		}
	    }
	default:
	    TODO /* missed one case ??? */
    }
    return(NULL);
}